

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spawner.cpp
# Opt level: O2

void __thiscall
spawner::Spawner::
Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>
          (Spawner *this,undefined8 *pRodata)

{
  pointer pcVar1;
  size_type sVar2;
  runtime_error *this_00;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  *(undefined8 *)((long)&(this->fn)._M_elems[0].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[0].super__Function_base._M_functor = this;
  (this->fn)._M_elems[0]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[0].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[1].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[1].super__Function_base._M_functor = this;
  (this->fn)._M_elems[1]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[1].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[2].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[2].super__Function_base._M_functor = this;
  (this->fn)._M_elems[2]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[2].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[3].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[3].super__Function_base._M_functor = this;
  (this->fn)._M_elems[3]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[3].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[4].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[4].super__Function_base._M_functor = this;
  (this->fn)._M_elems[4]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[4].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[5].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[5].super__Function_base._M_functor = this;
  (this->fn)._M_elems[5]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[5].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[6].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[6].super__Function_base._M_functor = this;
  (this->fn)._M_elems[6]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[6].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[7].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[7].super__Function_base._M_functor = this;
  (this->fn)._M_elems[7]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[7].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[8].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[8].super__Function_base._M_functor = this;
  (this->fn)._M_elems[8]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[8].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[9].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[9].super__Function_base._M_functor = this;
  (this->fn)._M_elems[9]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[9].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[10].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[10].super__Function_base._M_functor = this;
  (this->fn)._M_elems[10]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[10].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[0xb].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[0xb].super__Function_base._M_functor = this;
  (this->fn)._M_elems[0xb]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[0xb].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[0xc].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[0xc].super__Function_base._M_functor = this;
  (this->fn)._M_elems[0xc]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[0xc].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[0xd].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[0xd].super__Function_base._M_functor = this;
  (this->fn)._M_elems[0xd]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[0xd].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[0xe].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[0xe].super__Function_base._M_functor = this;
  (this->fn)._M_elems[0xe]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[0xe].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[0xf].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[0xf].super__Function_base._M_functor = this;
  (this->fn)._M_elems[0xf]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[0xf].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[0x10].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[0x10].super__Function_base._M_functor = this;
  (this->fn)._M_elems[0x10]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[0x10].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[0x11].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[0x11].super__Function_base._M_functor = this;
  (this->fn)._M_elems[0x11]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[0x11].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[0x12].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[0x12].super__Function_base._M_functor = this;
  (this->fn)._M_elems[0x12]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[0x12].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[0x13].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[0x13].super__Function_base._M_functor = this;
  (this->fn)._M_elems[0x13]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[0x13].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->fn)._M_elems[0x14].super__Function_base._M_functor + 8) = 0;
  *(Spawner **)&(this->fn)._M_elems[0x14].super__Function_base._M_functor = this;
  (this->fn)._M_elems[0x14]._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_invoke;
  (this->fn)._M_elems[0x14].super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/therooftopprinz[P]Logless/src/spawner.cpp:235:15)>
       ::_M_manager;
  pcVar1 = (pointer)pRodata[1];
  (this->mRodata).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)*pRodata;
  (this->mRodata).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcVar1;
  (this->mRodata).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)pRodata[2];
  pRodata[2] = 0;
  *pRodata = 0;
  pRodata[1] = 0;
  this->mState = Logpoint;
  this->mReadSz = 0;
  local_30._M_str =
       (this->mRodata).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_30._M_len =
       (long)(this->mRodata).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)local_30._M_str;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_30,"LoggerRefXD",0);
  this->mRefPos = sVar2;
  this->mLogPoint = (char *)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)&this->mSs);
  (this->tokenFormat)._M_dataplus._M_p = (pointer)&(this->tokenFormat).field_2;
  (this->tokenFormat)._M_string_length = 0;
  (this->tokenFormat).field_2._M_local_buf[0] = '\0';
  if (this->mRefPos != 0xffffffffffffffff) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"LoggerRefXD not found in rodata");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Spawner(std::vector<char>&& pRodata, std::integer_sequence<size_t, I...>)
        : fn({[this](){decodeParam(typename StateTraits<State(I)>::type());}...})
        , mRodata(std::move(pRodata))
        , mRefPos(std::string_view((char*)mRodata.data(), mRodata.size()).find("LoggerRefXD"))
    {
        if (std::string_view::npos == mRefPos)
            throw std::runtime_error("LoggerRefXD not found in rodata");
    }